

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_geninfo.c
# Opt level: O0

int metaConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  void **dest;
  void *info;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(char **)ptr = "s";
    }
    val_local._4_4_ = 0;
  }
  else if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
    val_local._4_4_ = 0;
  }
  else {
    val_local._4_4_ = _mpt_geninfo_conv(val + 1,type,ptr);
  }
  return val_local._4_4_;
}

Assistant:

static int metaConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const void *info = val + 1;
	void **dest = ptr;
	
	if (!type) {
		static const char types[] = { 's', 0 };
		if (dest) *dest = (void *) types;
		return 0;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (dest) *dest = (void *) val;
		return 0;
	}
	return _mpt_geninfo_conv(info, type, ptr);
}